

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

bool __thiscall
CNetBan::IsBanned(CNetBan *this,NETADDR_conflict *pAddr,char *pBuf,uint BufferSize,
                 int *pLastInfoQuery)

{
  CBan<CNetRange> *pBan;
  bool bVar1;
  uint Length;
  CBan<NETADDR> *pBan_00;
  CBan<CNetRange> **ppCVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  CNetHash aHash [17];
  CNetHash local_c8 [18];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Length = CNetHash::MakeHashArray(pAddr,local_c8);
  uVar3 = (ulong)Length;
  pBan_00 = CBanPool<NETADDR,_1>::Find(&this->m_BanAddrPool,pAddr,local_c8 + uVar3);
  if (pBan_00 == (CBan<NETADDR> *)0x0) {
    while (0 < (long)uVar3) {
      uVar3 = uVar3 - 1;
      ppCVar2 = (this->m_BanRangePool).m_paaHashList[local_c8[uVar3].m_HashIndex] +
                local_c8[uVar3].m_Hash;
      while (pBan = *ppCVar2, pBan != (CBan<CNetRange> *)0x0) {
        bVar1 = NetMatch(this,&pBan->m_Data,pAddr,(int)uVar3,Length);
        if (bVar1) {
          MakeBanInfo<CNetRange>(this,pBan,pBuf,BufferSize,0,pLastInfoQuery);
          goto LAB_001334e8;
        }
        ppCVar2 = &pBan->m_pHashNext;
      }
    }
    bVar1 = false;
  }
  else {
    MakeBanInfo<NETADDR>(this,pBan_00,pBuf,BufferSize,0,pLastInfoQuery);
LAB_001334e8:
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CNetBan::IsBanned(const NETADDR *pAddr, char *pBuf, unsigned BufferSize, int *pLastInfoQuery)
{
	CNetHash aHash[17];
	int Length = CNetHash::MakeHashArray(pAddr, aHash);

	// check ban addresses
	CBanAddr *pBan = m_BanAddrPool.Find(pAddr, &aHash[Length]);
	if(pBan)
	{
		MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
		return true;
	}

	// check ban ranges
	for(int i = Length-1; i >= 0; --i)
	{
		for(CBanRange *pBan = m_BanRangePool.First(&aHash[i]); pBan; pBan = pBan->m_pHashNext)
		{
			if(NetMatch(&pBan->m_Data, pAddr, i, Length))
			{
				MakeBanInfo(pBan, pBuf, BufferSize, MSGTYPE_PLAYER, pLastInfoQuery);
				return true;
			}
		}
	}

	return false;
}